

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtplibraryversion.cpp
# Opt level: O1

string * __thiscall
jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_
          (string *__return_storage_ptr__,RTPLibraryVersion *this)

{
  size_t sVar1;
  char str [16];
  char acStack_28 [24];
  
  snprintf(acStack_28,0x10,"%d.%d.%d",(ulong)(uint)this->majornr,(ulong)(uint)this->minornr,
           (ulong)(uint)this->debugnr);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_28,acStack_28 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string RTPLibraryVersion::GetVersionString() const
{
	char str[16];
	
	RTP_SNPRINTF(str,16,"%d.%d.%d",majornr,minornr,debugnr);
	
	return std::string(str);
}